

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O1

void thread2(void)

{
  ulong uVar1;
  char str [64];
  char **local_80;
  char *local_78 [9];
  
  local_78[0] = "[Thread 2] started";
  fiber_exec_on(&the_thread->fiber,&(the_thread->sched->main_thread).fiber,run_put_str,local_78);
  if (the_thread->sched->shutdown_signal == false) {
    uVar1 = 0;
    do {
      if (message == MsgFork) {
        fprintf((FILE *)out,"[Thread 2] forking worker: %d\n",uVar1);
        thread_start(the_thread->sched,worker);
LAB_001016c6:
        message = MsgNone;
      }
      else if (message == MsgPing) {
        fprintf((FILE *)out,"[Thread 2] received ping: %d\n",uVar1);
        goto LAB_001016c6;
      }
      snprintf((char *)local_78,0x40,"[Thread 2] running: %d",uVar1);
      local_80 = local_78;
      fiber_exec_on(&the_thread->fiber,&(the_thread->sched->main_thread).fiber,run_put_str,&local_80
                   );
      thread_switch(the_thread,the_thread->next);
      uVar1 = (ulong)((int)uVar1 + 1);
    } while (the_thread->sched->shutdown_signal != true);
  }
  local_78[0] = "[Thread 2] exiting";
  fiber_exec_on(&the_thread->fiber,&(the_thread->sched->main_thread).fiber,run_put_str,local_78);
  return;
}

Assistant:

static void
thread2(void)
{
    put_str("[Thread 2] started");
    int tok = 0;
    while (!shutting_down()) {
        switch (message) {
        case MsgNone:
            break;
        case MsgPing:
            fprintf(out, "[Thread 2] received ping: %d\n", tok);
            message = MsgNone;
            break;
        case MsgFork:
            fprintf(out, "[Thread 2] forking worker: %d\n", tok);
            thread_start(the_thread->sched, worker);
            message = MsgNone;
            break;
        }
        char str[64];
        snprintf(str, sizeof str, "[Thread 2] running: %d", tok++);
        put_str(str);
        yield();
    }
    put_str("[Thread 2] exiting");
}